

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpRepeatedFixed<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  int *piVar8;
  ulong uVar9;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  string *psVar10;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar11;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  uint64_t *puVar12;
  uint64_t *puVar13;
  uint *puVar14;
  uint *puVar15;
  uint uVar16;
  uint uVar17;
  LongSooRep *this;
  bool bVar19;
  bool bVar20;
  pair<const_char_*,_unsigned_int> pVar21;
  LogMessageFatal local_40 [16];
  uint uVar18;
  
  puVar14 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar14 & 3) != 0) {
    AlignFail(puVar14);
  }
  uVar18 = data.field_0._0_4_;
  uVar17 = uVar18 & 7;
  if (uVar17 == 2) {
    pcVar7 = MpPackedFixed<false>(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  uVar16 = *(ushort *)((long)puVar14 + 10) & 0x1c0;
  if ((ulong)uVar16 == 0xc0) {
    if (uVar17 != 1) {
      UNRECOVERED_JUMPTABLE = table->fallback;
      goto LAB_002a19f7;
    }
    this = (LongSooRep *)((long)&msg->_vptr_MessageLite + (ulong)*puVar14);
    if (((ulong)this & 7) != 0) {
LAB_002a1a7e:
      AlignFail(this);
    }
    puVar12 = (uint64_t *)ptr;
    do {
      aVar11.data = *puVar12;
      uVar9 = this->elements_int;
      bVar20 = (uVar9 & 4) == 0;
      iVar5 = SooRep::size((SooRep *)this,bVar20);
      iVar6 = 1;
      if ((this->elements_int & 4) != 0) {
        iVar6 = this->capacity;
      }
      if (iVar5 == iVar6) {
        RepeatedField<unsigned_long>::Grow
                  ((RepeatedField<unsigned_long> *)this,(uVar9 & 4) == 0,iVar5,iVar5 + 1);
      }
      bVar4 = iVar5 != iVar6;
      bVar19 = bVar4 && bVar20;
      piVar8 = &this->size;
      if (!bVar4 || !bVar20) {
        piVar8 = (int *)LongSooRep::elements(this);
      }
      iVar6 = SooRep::size((SooRep *)this,bVar19);
      if ((iVar6 != iVar5 + 1) && ((this->elements_int & 4) != 0)) {
        LongSooRep::elements(this);
      }
      pcVar7 = (char *)(ulong)bVar19;
      RepeatedField<unsigned_long>::set_size((RepeatedField<unsigned_long> *)this,bVar19,iVar5 + 1);
      ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(piVar8 + (long)iVar6 * 2))->data =
           (uint64_t)aVar11;
      ptr = (char *)(puVar12 + 1);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
        iVar6 = 4;
        ctx_00 = extraout_RDX;
        goto LAB_002a1976;
      }
      bVar1 = (byte)puVar12[1];
      puVar13 = (uint64_t *)((long)puVar12 + 9);
      ctx_00 = (ParseContext *)(ulong)bVar1;
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)puVar13;
        aVar11.data = (ulong)bVar2 << 7;
        uVar17 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        ctx_00 = (ParseContext *)(ulong)uVar17;
        if ((char)bVar2 < '\0') {
          pcVar7 = (char *)(ulong)uVar17;
          pVar21 = ReadTagFallback(ptr,uVar17);
          ctx_00 = pVar21._8_8_;
          puVar13 = (uint64_t *)pVar21.first;
        }
        else {
          puVar13 = (uint64_t *)((long)puVar12 + 10);
        }
      }
      if (puVar13 == (uint64_t *)0x0) {
        iVar6 = 5;
        goto LAB_002a1976;
      }
      puVar12 = puVar13;
    } while ((uint)ctx_00 == uVar18);
    iVar6 = 0;
LAB_002a1976:
    if (iVar6 == 0) {
LAB_002a19be:
      if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
        uVar17 = (uint)table->fast_idx_mask & (uint)(ushort)*(uint64_t *)ptr;
        if ((uVar17 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x44d);
        }
        uVar9 = (ulong)(uVar17 & 0xfffffff8);
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       ((ulong)(ushort)*(uint64_t *)ptr ^
                       *(ulong *)(&table[1].fast_idx_mask + uVar9 * 2));
        UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar9);
LAB_002a19f7:
        pcVar7 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
        return pcVar7;
      }
      uVar3 = table->has_bits_offset;
      goto LAB_002a1a0b;
    }
    if (iVar6 != 4) goto LAB_002a19a1;
  }
  else {
    if (uVar16 == 0x80) {
      psVar10 = (string *)0x0;
    }
    else {
      psVar10 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                          ((ulong)uVar16,0x80,
                           "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
    }
    if (psVar10 != (string *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x6fb,*(undefined8 *)(psVar10 + 8),*(undefined8 *)psVar10);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
    }
    if (uVar17 != 5) {
      UNRECOVERED_JUMPTABLE = table->fallback;
      goto LAB_002a19f7;
    }
    this = (LongSooRep *)((long)&msg->_vptr_MessageLite + (ulong)*puVar14);
    if (((ulong)this & 7) != 0) goto LAB_002a1a7e;
    puVar14 = (uint *)ptr;
    do {
      uVar17 = *puVar14;
      uVar9 = this->elements_int;
      bVar20 = (uVar9 & 4) == 0;
      iVar5 = SooRep::size((SooRep *)this,bVar20);
      iVar6 = 2;
      if ((this->elements_int & 4) != 0) {
        iVar6 = this->capacity;
      }
      if (iVar5 == iVar6) {
        RepeatedField<unsigned_int>::Grow
                  ((RepeatedField<unsigned_int> *)this,(uVar9 & 4) == 0,iVar5,iVar5 + 1);
      }
      bVar4 = iVar5 != iVar6;
      bVar19 = bVar4 && bVar20;
      piVar8 = &this->size;
      if (!bVar4 || !bVar20) {
        piVar8 = (int *)LongSooRep::elements(this);
      }
      iVar6 = SooRep::size((SooRep *)this,bVar19);
      if ((iVar6 != iVar5 + 1) && ((this->elements_int & 4) != 0)) {
        LongSooRep::elements(this);
      }
      pcVar7 = (char *)(ulong)bVar19;
      RepeatedField<unsigned_int>::set_size((RepeatedField<unsigned_int> *)this,bVar19,iVar5 + 1);
      aVar11.data._4_4_ = 0;
      aVar11.data._0_4_ = uVar17;
      piVar8[iVar6] = uVar17;
      ptr = (char *)(puVar14 + 1);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
        iVar6 = 4;
        ctx_00 = extraout_RDX_00;
        goto LAB_002a1988;
      }
      bVar1 = (byte)puVar14[1];
      puVar15 = (uint *)((long)puVar14 + 5);
      ctx_00 = (ParseContext *)(ulong)bVar1;
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)puVar15;
        aVar11.data = (ulong)bVar2 << 7;
        uVar17 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        ctx_00 = (ParseContext *)(ulong)uVar17;
        if ((char)bVar2 < '\0') {
          pcVar7 = (char *)(ulong)uVar17;
          pVar21 = ReadTagFallback(ptr,uVar17);
          ctx_00 = pVar21._8_8_;
          puVar15 = (uint *)pVar21.first;
        }
        else {
          puVar15 = (uint *)((long)puVar14 + 6);
        }
      }
      if (puVar15 == (uint *)0x0) {
        iVar6 = 5;
        goto LAB_002a1988;
      }
      puVar14 = puVar15;
    } while ((uint)ctx_00 == uVar18);
    iVar6 = 0;
LAB_002a1988:
    if (iVar6 == 5) {
LAB_002a19a1:
      pcVar7 = Error(msg,pcVar7,ctx_00,(TcFieldData)aVar11,table,hasbits);
      return pcVar7;
    }
    if (iVar6 != 4) goto LAB_002a19be;
  }
  uVar3 = table->has_bits_offset;
LAB_002a1a0b:
  if ((ulong)uVar3 != 0) {
    puVar14 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)uVar3);
    if (((ulong)puVar14 & 3) != 0) {
      AlignFail();
    }
    *puVar14 = *puVar14 | (uint)hasbits;
  }
  return (char *)(uint64_t *)ptr;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedFixed(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Check for packed repeated fallback:
  if (decoded_wiretype == WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return MpPackedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  const uint16_t type_card = entry.type_card;
  const uint16_t rep = type_card & field_layout::kRepMask;
  if (rep == field_layout::kRep64Bits) {
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED64) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint64_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint64_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint64_t>(ptr);
      ptr += size;
      if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED32) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint32_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint32_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint32_t>(ptr);
      ptr += size;
      if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}